

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STArray.cpp
# Opt level: O2

Value __thiscall jbcoin::STArray::getJson(STArray *this,int p)

{
  long *plVar1;
  int iVar2;
  Value *pVVar3;
  undefined4 in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  int __val;
  Value VVar6;
  Value local_60;
  string k;
  
  Json::Value::Value((Value *)this,arrayValue);
  plVar1 = *(long **)(CONCAT44(in_register_00000034,p) + 0x18);
  __val = 1;
  uVar4 = extraout_RDX;
  for (plVar5 = *(long **)(CONCAT44(in_register_00000034,p) + 0x10); plVar5 != plVar1;
      plVar5 = plVar5 + 6) {
    iVar2 = (**(code **)(*plVar5 + 0x20))(plVar5);
    uVar4 = extraout_RDX_00;
    if (iVar2 != 0) {
      Json::Value::Value((Value *)&k,objectValue);
      pVVar3 = Json::Value::append((Value *)this,(Value *)&k);
      Json::Value::~Value((Value *)&k);
      if (*(long *)(plVar5[1] + 0x18) == 0) {
        std::__cxx11::to_string(&k,__val);
      }
      else {
        std::__cxx11::string::string((string *)&k,(string *)(plVar5[1] + 0x10));
      }
      (**(code **)(*plVar5 + 0x38))(&local_60,plVar5,in_EDX);
      pVVar3 = Json::Value::operator[](pVVar3,k._M_dataplus._M_p);
      Json::Value::swap(pVVar3,&local_60);
      Json::Value::~Value(&local_60);
      __val = __val + 1;
      std::__cxx11::string::~string((string *)&k);
      uVar4 = extraout_RDX_01;
    }
  }
  VVar6._8_8_ = uVar4;
  VVar6.value_.map_ = (ObjectValues *)this;
  return VVar6;
}

Assistant:

Json::Value STArray::getJson (int p) const
{
    Json::Value v = Json::arrayValue;
    int index = 1;
    for (auto const& object: v_)
    {
        if (object.getSType () != STI_NOTPRESENT)
        {
            Json::Value& inner = v.append (Json::objectValue);
            auto const& fname = object.getFName ();
            auto k = fname.hasName () ? fname.fieldName : std::to_string(index);
            inner[k] = object.getJson (p);
            index++;
        }
    }
    return v;
}